

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall Diligent::DeviceContextVkImpl::InvalidateState(DeviceContextVkImpl *this)

{
  long lVar1;
  string _msg;
  
  if ((this->m_State).NumCommands != 0) {
    FormatString<char[104]>
              (&_msg,(char (*) [104])
                     "Invalidating context that has outstanding commands in it. Call Flush() to submit commands for execution"
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
  }
  DeviceContextBase<Diligent::EngineVkImplTraits>::InvalidateState
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  (this->m_State).CommittedVBsUpToDate = false;
  (this->m_State).CommittedIBUpToDate = false;
  (this->m_State).ShadingRateIsSet = false;
  (this->m_State).NullRenderTargets = false;
  (this->m_State).NumCommands = 0;
  (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_MAX_ENUM;
  lVar1 = 0;
  do {
    ResourceBindInfo::ResourceBindInfo((ResourceBindInfo *)((long)&_msg._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + 0x1f0;
  } while (lVar1 != 0x5d0);
  std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL>::operator=
            (&this->m_BindInfo,(array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL> *)&_msg)
  ;
  std::array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL>::~array
            ((array<Diligent::DeviceContextVkImpl::ResourceBindInfo,_3UL> *)&_msg);
  this->m_vkRenderPass = (VkRenderPass)0x0;
  this->m_vkFramebuffer = (VkFramebuffer)0x0;
  std::
  __uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
  ::reset((__uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
           *)&this->m_DynamicRenderingInfo,(pointer)0x0);
  if (((this->m_CommandBuffer).m_State.RenderPass != (VkRenderPass)0x0) ||
     ((this->m_CommandBuffer).m_State.DynamicRenderingHash != 0)) {
    FormatString<char[49]>(&_msg,(char (*) [49])"Invalidating context with unfinished render pass");
    DebugAssertionFailed
              (_msg._M_dataplus._M_p,"InvalidateState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x677);
    std::__cxx11::string::~string((string *)&_msg);
  }
  VulkanUtilities::VulkanCommandBuffer::Reset(&this->m_CommandBuffer);
  return;
}

Assistant:

void DeviceContextVkImpl::InvalidateState()
{
    if (m_State.NumCommands != 0)
        LOG_WARNING_MESSAGE("Invalidating context that has outstanding commands in it. Call Flush() to submit commands for execution");

    TDeviceContextBase::InvalidateState();
    m_State         = {};
    m_BindInfo      = {};
    m_vkRenderPass  = VK_NULL_HANDLE;
    m_vkFramebuffer = VK_NULL_HANDLE;
    m_DynamicRenderingInfo.reset();

    VERIFY(!m_CommandBuffer.IsInRenderScope(), "Invalidating context with unfinished render pass");
    m_CommandBuffer.Reset();
}